

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Option_inl.hpp
# Opt level: O2

string * __thiscall CLI::Option::matching_name_abi_cxx11_(Option *this,Option *other)

{
  bool bVar1;
  __type _Var2;
  int iVar3;
  string *psVar4;
  byte bVar5;
  string *name;
  string *lname;
  string *psVar6;
  string *sname;
  string local_170;
  string local_150;
  string local_130;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  string local_90;
  string local_70;
  string local_50;
  
  if ((matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_ == '\0') &&
     (iVar3 = __cxa_guard_acquire(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_)
     , iVar3 != 0)) {
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_dataplus._M_p =
         (pointer)&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_._M_string_length = 0;
    matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_.field_2._M_local_buf[0] = '\0';
    __cxa_atexit(::std::__cxx11::string::~string,
                 &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_);
  }
  bVar5 = (other->super_OptionBase<CLI::Option>).configurable_ &
          (this->super_OptionBase<CLI::Option>).configurable_;
  psVar4 = (this->snames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->snames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4; psVar6 = psVar6 + 1) {
    ::std::__cxx11::string::string((string *)&local_50,(string *)psVar6);
    bVar1 = check_sname(other,&local_50);
    ::std::__cxx11::string::~string((string *)&local_50);
    if (bVar1) {
      return psVar6;
    }
    if (bVar5 != 0) {
      ::std::__cxx11::string::string((string *)&local_70,(string *)psVar6);
      bVar1 = check_lname(other,&local_70);
      ::std::__cxx11::string::~string((string *)&local_70);
      if (bVar1) {
        return psVar6;
      }
    }
  }
  psVar4 = (this->lnames_).
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (psVar6 = (this->lnames_).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4; psVar6 = psVar6 + 1) {
    ::std::__cxx11::string::string((string *)&local_f0,(string *)psVar6);
    bVar1 = check_lname(other,&local_f0);
    ::std::__cxx11::string::~string((string *)&local_f0);
    if (bVar1) {
      return psVar6;
    }
    if ((psVar6->_M_string_length == 1 & bVar5) == 1) {
      ::std::__cxx11::string::string((string *)&local_90,(string *)psVar6);
      bVar1 = check_sname(other,&local_90);
      ::std::__cxx11::string::~string((string *)&local_90);
      if (bVar1) {
        return psVar6;
      }
    }
  }
  if (bVar5 == 0) goto LAB_00115185;
  if ((((this->snames_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start ==
        (this->snames_).
        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish) &&
      ((this->lnames_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_start ==
       (this->lnames_).
       super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
       ._M_impl.super__Vector_impl_data._M_finish)) && ((this->pname_)._M_string_length != 0)) {
    psVar6 = &this->pname_;
    ::std::__cxx11::string::string((string *)&local_150,(string *)psVar6);
    bVar1 = check_sname(other,&local_150);
    if (bVar1) {
      psVar4 = &local_150;
      goto LAB_0011530c;
    }
    ::std::__cxx11::string::string((string *)&local_110,(string *)psVar6);
    name = &local_110;
    bVar1 = check_lname(other,name);
    if (!bVar1) {
      _Var2 = ::std::operator==(psVar6,&other->pname_);
      ::std::__cxx11::string::~string((string *)&local_110);
      ::std::__cxx11::string::~string((string *)&local_150);
      if (_Var2) {
        return psVar6;
      }
      goto LAB_0011516d;
    }
    psVar4 = &local_150;
  }
  else {
LAB_0011516d:
    if ((((other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start !=
          (other->snames_).
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_finish) ||
        ((other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_start !=
         (other->fnames_).
         super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ._M_impl.super__Vector_impl_data._M_finish)) || ((other->pname_)._M_string_length == 0)) {
LAB_00115185:
      if (((this->super_OptionBase<CLI::Option>).ignore_case_ != false) ||
         ((this->super_OptionBase<CLI::Option>).ignore_underscore_ == true)) {
        psVar4 = (other->snames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (other->snames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4;
            psVar6 = psVar6 + 1) {
          ::std::__cxx11::string::string((string *)&local_b0,(string *)psVar6);
          bVar1 = check_sname(this,&local_b0);
          ::std::__cxx11::string::~string((string *)&local_b0);
          if (bVar1) {
            return psVar6;
          }
        }
        psVar4 = (other->lnames_).
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        for (psVar6 = (other->lnames_).
                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start; psVar6 != psVar4;
            psVar6 = psVar6 + 1) {
          ::std::__cxx11::string::string((string *)&local_d0,(string *)psVar6);
          bVar1 = check_lname(this,&local_d0);
          ::std::__cxx11::string::~string((string *)&local_d0);
          if (bVar1) {
            return psVar6;
          }
        }
      }
      return &matching_name[abi:cxx11](CLI::Option_const&)::estring_abi_cxx11_;
    }
    psVar6 = &other->pname_;
    ::std::__cxx11::string::string((string *)&local_170,(string *)psVar6);
    bVar1 = check_sname(this,&local_170);
    if (bVar1) {
      psVar4 = &local_170;
      goto LAB_0011530c;
    }
    ::std::__cxx11::string::string((string *)&local_130,(string *)psVar6);
    name = &local_130;
    bVar1 = check_lname(this,name);
    if (!bVar1) {
      _Var2 = ::std::operator==(&this->pname_,psVar6);
      ::std::__cxx11::string::~string((string *)&local_130);
      ::std::__cxx11::string::~string((string *)&local_170);
      if (_Var2) {
        return psVar6;
      }
      goto LAB_00115185;
    }
    psVar4 = &local_170;
  }
  ::std::__cxx11::string::~string((string *)name);
LAB_0011530c:
  ::std::__cxx11::string::~string((string *)psVar4);
  return psVar6;
}

Assistant:

CLI11_NODISCARD CLI11_INLINE const std::string &Option::matching_name(const Option &other) const {
    static const std::string estring;
    bool bothConfigurable = configurable_ && other.configurable_;
    for(const std::string &sname : snames_) {
        if(other.check_sname(sname))
            return sname;
        if(bothConfigurable && other.check_lname(sname))
            return sname;
    }
    for(const std::string &lname : lnames_) {
        if(other.check_lname(lname))
            return lname;
        if(lname.size() == 1 && bothConfigurable) {
            if(other.check_sname(lname)) {
                return lname;
            }
        }
    }
    if(bothConfigurable && snames_.empty() && lnames_.empty() && !pname_.empty()) {
        if(other.check_sname(pname_) || other.check_lname(pname_) || pname_ == other.pname_)
            return pname_;
    }
    if(bothConfigurable && other.snames_.empty() && other.fnames_.empty() && !other.pname_.empty()) {
        if(check_sname(other.pname_) || check_lname(other.pname_) || (pname_ == other.pname_))
            return other.pname_;
    }
    if(ignore_case_ ||
       ignore_underscore_) {  // We need to do the inverse, in case we are ignore_case or ignore underscore
        for(const std::string &sname : other.snames_)
            if(check_sname(sname))
                return sname;
        for(const std::string &lname : other.lnames_)
            if(check_lname(lname))
                return lname;
    }
    return estring;
}